

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.h
# Opt level: O0

void __thiscall
gulcalc::gulcalc(gulcalc *this,
                vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec,vector<float,_std::allocator<float>_> *tivs,
                map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
                *item_map,getRands *rnd,getRands *rnd0,_func_void_void_ptr_int_int *itemWriter,
                _func_void_void_ptr_int_int *coverageWriter,_func_void_void_ptr_int_int *lossWriter,
                _func_void_void_ptr_int_int *correlatedWriter,_func_bool_char_ptr_int *iGetrec,
                gulcalcopts *opt)

{
  uint uVar1;
  size_type sVar2;
  uchar *puVar3;
  getRands *rnd0_local;
  getRands *rnd_local;
  map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  *item_map_local;
  vector<float,_std::allocator<float>_> *tivs_local;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> *damagebindictionary_vec_local;
  gulcalc *this_local;
  
  this->rand_seed_ = 0;
  gulcalcopts::gulcalcopts(&this->opt_,opt);
  this->num_idx_ = 5;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->cov_);
  std::
  vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ::vector(&this->mode1_);
  std::
  vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ::vector(&this->fullCorr_);
  std::
  vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
  ::vector(&this->mode1_stats_);
  std::map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
  ::map(&this->bin_map_);
  std::vector<prob_mean,_std::allocator<prob_mean>_>::vector(&this->bin_lookup_);
  std::vector<int,_std::allocator<int>_>::vector(&this->mode1UsedCoverageIDs_);
  this->itembufoffset_ = 0;
  this->correlatedbufoffset_ = 0;
  this->covbufoffset_ = 0;
  this->damagebindictionary_vec_ = damagebindictionary_vec;
  this->coverages_ = tivs;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(this->coverages_);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(&this->cov_,sVar2);
  if (0 < opt->allocRule) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(this->coverages_);
    std::
    vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
    ::resize(&this->mode1_,sVar2);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(this->coverages_);
    std::
    vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
    ::resize(&this->mode1_stats_,sVar2);
  }
  if ((opt->correlatedLevelOutput & 1U) == 1) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(this->coverages_);
    std::
    vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
    ::resize(&this->fullCorr_,sVar2);
  }
  this->item_map_ = item_map;
  this->rnd_ = rnd;
  this->rnd0_ = rnd0;
  this->itemWriter_ = itemWriter;
  this->coverageWriter_ = coverageWriter;
  this->lossWriter_ = lossWriter;
  this->correlatedWriter_ = correlatedWriter;
  this->iGetrec_ = iGetrec;
  puVar3 = (uchar *)operator_new__(0x3e90);
  this->ibuf_ = puVar3;
  puVar3 = (uchar *)operator_new__(0x3e90);
  this->corrbuf_ = puVar3;
  puVar3 = (uchar *)operator_new__(0x3e90);
  this->cbuf_ = puVar3;
  this->alloc_rule_ = opt->allocRule;
  this->loss_threshold_ = opt->loss_threshold;
  this->rndopt_ = opt->rndopt;
  this->debug_ = (bool)(opt->debug & 1);
  this->benchmark_ = (bool)(opt->benchmark & 1);
  this->samplesize_ = opt->samplesize;
  this->isFirstItemEvent_ = true;
  this->isFirstCorrelatedEvent_ = true;
  this->isFirstCovEvent_ = true;
  uVar1 = getRands::getp1(this->rnd_);
  this->p1_ = (ulong)uVar1;
  uVar1 = getRands::getp2(this->rnd_,(uint)this->p1_);
  this->p2_ = (ulong)uVar1;
  uVar1 = getRands::getp2(this->rnd_,this->samplesize_);
  this->p3_ = (ulong)uVar1;
  this->rand_seed_ = opt->rand_seed;
  return;
}

Assistant:

gulcalc(const std::vector<damagebindictionary> &damagebindictionary_vec,const std::vector<OASIS_FLOAT> &tivs,
		const std::map<item_map_key, std::vector<item_map_rec> > &item_map, getRands &rnd, getRands &rnd0, 		
		void (*itemWriter)(const void *ibuf,int size, int count),
		void(*coverageWriter)(const void *ibuf,int size, int count),
		void (*lossWriter)(const void *ibuf, int size, int count),
		void(*correlatedWriter)(const void *ibuf, int size, int count),
		bool(*iGetrec)(char *rec, int recsize),
		const gulcalcopts& opt
		): opt_(opt) {
			damagebindictionary_vec_ = &damagebindictionary_vec;
			coverages_ = &tivs;
			cov_.resize(coverages_->size());
			if (opt.allocRule > 0) {
				mode1_.resize(coverages_->size());
				mode1_stats_.resize(coverages_->size());
			}
			if (opt.correlatedLevelOutput == true) {
				fullCorr_.resize(coverages_->size());
			}
			item_map_ = &item_map;
			rnd_ = &rnd;
			rnd0_ = &rnd0;

			itemWriter_ = itemWriter;
			coverageWriter_ = coverageWriter;
        		lossWriter_ = lossWriter;
			correlatedWriter_ = correlatedWriter;
			iGetrec_ = iGetrec;
			ibuf_ = new unsigned char[bufsize + sizeof(gulitemSampleslevel)]; // make the allocation bigger by 1 record to avoid overrunning
			corrbuf_ = new unsigned char[bufsize + sizeof(gulitemSampleslevel)];   // make the allocation bigger by 1 record to avoid overrunning
			cbuf_ = new unsigned char[bufsize + sizeof(gulitemSampleslevel)]; // make the allocation bigger by 1 record to avoid overrunning
			//TODO: when using double precision, these buffers above are overflowing,
			//the hack fix is to replace sizeof(gulitemSampleslevel) with 2*sizeof(gulitemSampleslevel)
			alloc_rule_ = opt.allocRule;
			loss_threshold_ = opt.loss_threshold;
			rndopt_ = opt.rndopt;				
			debug_ = opt.debug;
			benchmark_ = opt.benchmark;
			samplesize_ = opt.samplesize;
			isFirstItemEvent_ = true;
			isFirstCorrelatedEvent_ = true;
			isFirstCovEvent_ = true;
			p1_ = rnd_->getp1();	// prime p1	make these long to force below expression to not have sign problem
			p2_ = rnd_->getp2((unsigned int)p1_);  // prime no p2
			p3_ = rnd_->getp2((unsigned int)samplesize_);	// use as additional offset to stop overlapping of random numbers 
			rand_seed_ = opt.rand_seed;
	}